

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uchar uVar5;
  int iVar6;
  int __fd;
  int iVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  undefined8 *in_RSI;
  int in_EDI;
  bool bVar11;
  timespec tVar12;
  timespec tVar13;
  int enable_canfd;
  int loopback;
  int64_t start_time_ns;
  option long_options [3];
  int ret;
  timeval now;
  ifreq ifr;
  FILE *in_stack_000000f0;
  int i;
  can_frame *ccf;
  sockaddr_can addr;
  int s;
  int opt;
  uchar fixdata [64];
  unsigned_long rnd;
  int incdlc;
  uint64_t incdata;
  int maxdlen;
  int mtu;
  unsigned_long burst_sent_count;
  int count;
  uchar len8_dlc;
  uchar rtr_frame;
  uchar verbose;
  uchar loopback_disable;
  uchar dlc_mode;
  uchar data_mode;
  uchar id_mode;
  uchar mix;
  uchar esi;
  uchar brs;
  uchar canfd;
  uchar extended;
  unsigned_long polltimeout;
  unsigned_long burst_count;
  double gap;
  undefined1 in_stack_fffffffffffffe40 [16];
  uchar *in_stack_fffffffffffffe50;
  sockaddr *__addr;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  __time_t local_190;
  __syscall_slong_t local_188;
  undefined1 local_178 [84];
  int in_stack_fffffffffffffedc;
  size_t in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  uint local_108;
  undefined1 local_100 [16];
  int local_f0;
  uint local_d4;
  canfd_frame *local_d0;
  sockaddr local_c8;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  canfd_frame *in_stack_ffffffffffffff58;
  FILE *in_stack_ffffffffffffff60;
  __u8 local_60 [12];
  int local_54;
  ulong local_50;
  uint local_48;
  ulong local_40;
  int local_38;
  byte local_32;
  char local_30;
  char local_2f;
  char local_2e;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  ulong local_20;
  
  local_20 = 1;
  local_29 = 0;
  local_2a = 0;
  local_2b = 0;
  local_2c = 0;
  bVar4 = false;
  local_2e = '\0';
  local_2f = '\0';
  local_30 = '\0';
  bVar2 = false;
  local_32 = 0;
  bVar11 = false;
  bVar3 = false;
  local_38 = 0;
  local_40 = 0;
  local_50 = 0;
  local_54 = 0;
  memset(&local_c8,0,0x18);
  local_d0 = &main::frame;
  gettimeofday((timeval *)&stack0xfffffffffffffef0,(__timezone_ptr_t)0x0);
  srandom(local_108);
  signal(0xf,sigterm);
  signal(1,sigterm);
  signal(2,sigterm);
  memcpy(local_178,&PTR_anon_var_dwarf_2a1_00108d70,0x60);
  while (iVar6 = getopt_long(in_EDI,in_RSI,"g:atefbER8mI:L:D:p:n:ixc:vh?",local_178), iVar6 != -1) {
    switch(iVar6) {
    case 0x38:
      bVar3 = true;
      break;
    case 0x3f:
    case 0x68:
    default:
      __xpg_basename((char *)*in_RSI);
      print_usage((char *)0x102979);
      return 1;
    case 0x44:
      if (*_optarg == 'r') {
        local_2f = '\0';
      }
      else if (*_optarg == 'i') {
        local_2f = '\x01';
      }
      else {
        local_2f = '\x02';
        iVar6 = hexstring2data((char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
                               ,in_stack_fffffffffffffe50,in_stack_fffffffffffffe40._12_4_);
        if (iVar6 != 0) {
          printf("wrong fix data definition\n");
          return 1;
        }
      }
      break;
    case 0x45:
      local_2c = 1;
      local_2a = 1;
      break;
    case 0x49:
      if (*_optarg == 'r') {
        local_2e = '\0';
      }
      else if (*_optarg == 'i') {
        local_2e = '\x01';
      }
      else if (*_optarg == 'e') {
        local_2e = '\x03';
      }
      else if (*_optarg == 'o') {
        local_2e = '\x04';
      }
      else {
        local_2e = '\x02';
        uVar10 = strtoul(_optarg,(char **)0x0,0x10);
        main::frame.can_id = (canid_t)uVar10;
      }
      break;
    case 0x4c:
      if (*_optarg == 'r') {
        local_30 = '\0';
      }
      else if (*_optarg == 'i') {
        local_30 = '\x01';
      }
      else {
        local_30 = '\x02';
        iVar6 = atoi(_optarg);
        main::frame.len = (__u8)iVar6;
      }
      break;
    case 0x52:
      bVar11 = true;
      break;
    case 0x61:
      clock_nanosleep_flags = 1;
      break;
    case 0x62:
      local_2b = 1;
      local_2a = 1;
      break;
    case 99:
      local_20 = strtoul(_optarg,(char **)0x0,10);
      break;
    case 0x65:
      local_29 = 1;
      break;
    case 0x66:
      local_2a = 1;
      break;
    case 0x67:
      strtod(_optarg,(char **)0x0);
      break;
    case 0x69:
      ignore_enobufs = true;
      break;
    case 0x6d:
      bVar4 = true;
      local_2a = 1;
      break;
    case 0x6e:
      local_38 = atoi(_optarg);
      if (local_38 < 1) {
        __xpg_basename((char *)*in_RSI);
        print_usage((char *)0x102906);
        return 1;
      }
      break;
    case 0x70:
      strtoul(_optarg,(char **)0x0,10);
      break;
    case 0x74:
      clock_nanosleep_flags = 1;
      use_so_txtime = true;
      break;
    case 0x76:
      local_32 = local_32 + 1;
      break;
    case 0x78:
      bVar2 = true;
      break;
    case 0x100:
      uVar10 = strtoul(_optarg,(char **)0x0,0);
      so_mark_val = (int)uVar10;
      break;
    case 0x101:
      strtoll(_optarg,(char **)0x0,0);
      tVar12 = ns_to_timespec((int64_t)in_stack_fffffffffffffe50);
      local_190 = tVar12.tv_sec;
      ts.tv_sec = local_190;
      local_188 = tVar12.tv_nsec;
      ts.tv_nsec = local_188;
    }
  }
  if (_optind == in_EDI) {
    __xpg_basename((char *)*in_RSI);
    print_usage((char *)0x1029b8);
    return 1;
  }
  tVar12 = double_to_timespec(in_stack_fffffffffffffe40._0_8_);
  ts_gap.tv_sec = tVar12.tv_sec;
  ts_gap.tv_nsec = tVar12.tv_nsec;
  if (((local_2e == '\x02') && (0x7ff < main::frame.can_id)) && (local_29 == 0)) {
    printf("The given CAN-ID is greater than 0x7FF and the \'-e\' option is not set.\n");
    return 1;
  }
  sVar8 = strlen((char *)in_RSI[_optind]);
  if (0xf < sVar8) {
    printf("Name of CAN device \'%s\' is too long!\n\n",in_RSI[_optind]);
    return 1;
  }
  __fd = socket(0x1d,3,1);
  if (__fd < 0) {
    perror("socket");
    return 1;
  }
  local_c8.sa_family = 0x1d;
  local_c8.sa_data._2_4_ = if_nametoindex((char *)in_RSI[_optind]);
  if (local_c8.sa_data._2_4_ == 0) {
    perror("if_nametoindex");
    return 1;
  }
  setsockopt(__fd,0x65,1,(void *)0x0,0);
  if (bVar2) {
    in_stack_fffffffffffffe5c = 0;
    setsockopt(__fd,0x65,3,&stack0xfffffffffffffe5c,4);
  }
  if (local_2a == 0) {
    if (bVar3) {
      if (0xf < main::frame.len) {
        main::frame.len = '\x0f';
      }
      if (8 < main::frame.len) {
        local_d0->__res1 = main::frame.len;
      }
    }
    if (8 < main::frame.len) {
      main::frame.len = '\b';
    }
  }
  else {
    in_stack_fffffffffffffe58 = 1;
    iVar7 = ioctl(__fd,0x8921,local_100);
    if (iVar7 < 0) {
      perror("SIOCGIFMTU");
      return 1;
    }
    if (local_f0 != 0x48) {
      printf("CAN interface is not CAN FD capable - sorry.\n");
      return 1;
    }
    iVar7 = setsockopt(__fd,0x65,5,&stack0xfffffffffffffe58,4);
    if (iVar7 != 0) {
      printf("error when enabling CAN FD support\n");
      return 1;
    }
    uVar5 = can_fd_len2dlc(main::frame.len);
    main::frame.len = can_fd_dlc2len(uVar5);
  }
  __addr = &local_c8;
  iVar7 = bind(__fd,__addr,0x18);
  if (iVar7 < 0) {
    perror("bind");
    return 1;
  }
  if (((use_so_txtime & 1U) != 0) && (iVar7 = setsockopt_txtime((int)tVar12.tv_sec), iVar7 != 0)) {
    return 1;
  }
  iVar7 = setup_time();
  if (iVar7 != 0) {
    return 1;
  }
  iVar7 = 0;
  while( true ) {
    if (running == 0) {
      if (enobufs_count != 0) {
        printf("\nCounted %llu ENOBUFS return values on write().\n\n",enobufs_count);
      }
      close(__fd);
      return 0;
    }
    main::frame.flags = '\0';
    if ((local_38 != 0) && (local_38 = local_38 + -1, local_38 == 0)) {
      running = 0;
    }
    if (local_2a == 0) {
      local_48 = 8;
    }
    else {
      local_48 = 0x40;
      main::frame.flags = local_2b != 0;
      if (local_2c != 0) {
        main::frame.flags = main::frame.flags | 2;
      }
    }
    if (local_2e == '\0') {
      lVar9 = random();
      main::frame.can_id = (canid_t)lVar9;
    }
    else if (local_2e == '\x03') {
      lVar9 = random();
      main::frame.can_id = (uint)lVar9 & 0xfffffffe;
    }
    else if (local_2e == '\x04') {
      lVar9 = random();
      main::frame.can_id = (uint)lVar9 | 1;
    }
    if (local_29 == 0) {
      main::frame.can_id = main::frame.can_id & 0x7ff;
    }
    else {
      main::frame.can_id = main::frame.can_id & 0x1fffffff | 0x80000000;
    }
    if ((bVar11) && (local_2a == 0)) {
      main::frame.can_id = main::frame.can_id | 0x40000000;
    }
    if (local_30 == '\0') {
      if (local_2a == 0) {
        lVar9 = random();
        main::frame.len = (byte)lVar9 & 0xf;
        if (main::frame.len < 9) {
          local_d0->__res1 = '\0';
        }
        else {
          if (bVar3) {
            local_d0->__res1 = main::frame.len;
          }
          main::frame.len = '\b';
        }
      }
      else {
        lVar9 = random();
        main::frame.len = can_fd_dlc2len((byte)lVar9 & 0xf);
      }
    }
    if ((local_2f == '\x01') && (main::frame.len == '\0')) {
      main::frame.len = '\x01';
    }
    if (local_2f == '\0') {
      lVar9 = random();
      local_60._0_4_ = (undefined4)lVar9;
      main::frame.data[0] = local_60[0];
      main::frame.data[1] = local_60[1];
      main::frame.data[2] = local_60[2];
      main::frame.data[3] = local_60[3];
      lVar9 = random();
      local_60._0_4_ = (undefined4)lVar9;
      main::frame.data[4] = local_60[0];
      main::frame.data[5] = local_60[1];
      main::frame.data[6] = local_60[2];
      main::frame.data[7] = local_60[3];
      if ((local_2a != 0) && (8 < main::frame.len)) {
        main::frame.data[0xc] = local_60[0];
        main::frame.data[0xd] = local_60[1];
        main::frame.data[0xe] = local_60[2];
        main::frame.data[0xf] = local_60[3];
        main::frame.data[8] = main::frame.data[0];
        main::frame.data[9] = main::frame.data[1];
        main::frame.data[10] = main::frame.data[2];
        main::frame.data[0xb] = main::frame.data[3];
        main::frame.data[0x14] = local_60[0];
        main::frame.data[0x15] = local_60[1];
        main::frame.data[0x16] = local_60[2];
        main::frame.data[0x17] = local_60[3];
        main::frame.data[0x10] = main::frame.data[0];
        main::frame.data[0x11] = main::frame.data[1];
        main::frame.data[0x12] = main::frame.data[2];
        main::frame.data[0x13] = main::frame.data[3];
        main::frame.data[0x24] = local_60[0];
        main::frame.data[0x25] = local_60[1];
        main::frame.data[0x26] = local_60[2];
        main::frame.data[0x27] = local_60[3];
        main::frame.data[0x20] = main::frame.data[0];
        main::frame.data[0x21] = main::frame.data[1];
        main::frame.data[0x22] = main::frame.data[2];
        main::frame.data[0x23] = main::frame.data[3];
        main::frame.data._24_8_ = main::frame.data._8_8_;
        main::frame.data._40_8_ = main::frame.data._8_8_;
        main::frame.data._48_8_ = main::frame.data._16_8_;
        main::frame.data._56_8_ = main::frame.data._8_8_;
      }
    }
    if (local_2f == '\x02') {
      memcpy(main::frame.data,&stack0xffffffffffffff58,0x40);
    }
    if (main::frame.len < local_48) {
      memset(main::frame.data + main::frame.len,0,(long)(int)(local_48 - main::frame.len));
    }
    if (((use_so_txtime & 1U) == 0) &&
       (((ts.tv_sec != 0 || (ts.tv_nsec != 0)) && (local_20 <= local_40)))) {
      if (clock_nanosleep_flags == 1) {
        tVar13.tv_nsec._0_4_ = in_stack_fffffffffffffe58;
        tVar13.tv_sec = (__time_t)__addr;
        tVar13.tv_nsec._4_4_ = in_stack_fffffffffffffe5c;
        tVar13 = timespec_add(tVar12,tVar13);
        ts.tv_sec = tVar13.tv_sec;
        ts.tv_nsec = tVar13.tv_nsec;
      }
      iVar7 = clock_nanosleep(clockid,clock_nanosleep_flags,(timespec *)&ts,(timespec *)0x0);
      if ((iVar7 != 0) && (iVar7 != 4)) {
        perror("clock_nanosleep");
        return 1;
      }
    }
    if (local_32 != 0) {
      printf("  %s  ",in_RSI[_optind]);
      if (local_32 < 2) {
        fprint_canframe(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        (char *)CONCAT44(iVar6,__fd),in_stack_ffffffffffffff4c,
                        in_stack_ffffffffffffff48);
      }
      else {
        fprint_long_canframe
                  (in_stack_000000f0,(canfd_frame *)ifr.ifr_ifru._16_8_,
                   (char *)ifr.ifr_ifru.ifru_map.mem_end,ifr.ifr_ifru.ifru_map.mem_start._4_4_,
                   ifr.ifr_ifru.ifru_ivalue);
      }
    }
    iVar7 = do_send_one(in_stack_fffffffffffffef0,(void *)CONCAT44(iVar7,in_stack_fffffffffffffee8),
                        in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    if (iVar7 != 0) break;
    if (local_20 <= local_40) {
      local_40 = 0;
    }
    local_40 = local_40 + 1;
    if (local_2e == '\x01') {
      main::frame.can_id = main::frame.can_id + 1;
    }
    if (local_30 == '\x01') {
      local_54 = (local_54 + 1) % 0x10;
      uVar5 = (uchar)local_54;
      if ((local_2a == 0) || (bVar4)) {
        if (bVar3) {
          if (local_54 < 9) {
            main::frame.len = uVar5;
            local_d0->__res1 = '\0';
          }
          else {
            main::frame.len = '\b';
            local_d0->__res1 = uVar5;
          }
        }
        else {
          local_54 = local_54 % 9;
          main::frame.len = (__u8)local_54;
        }
      }
      else {
        main::frame.len = can_fd_dlc2len(uVar5);
      }
    }
    if (local_2f == '\x01') {
      local_50 = local_50 + 1;
      for (local_d4 = 0; (int)local_d4 < 8; local_d4 = local_d4 + 1) {
        main::frame.data[(int)local_d4] = (__u8)(local_50 >> ((byte)(local_d4 << 3) & 0x3f));
      }
    }
    if (bVar4) {
      uVar10 = random();
      local_d4 = (uint)uVar10;
      bVar1 = (byte)uVar10;
      local_29 = bVar1 & 1;
      local_2a = bVar1 & 2;
      if ((uVar10 & 2) != 0) {
        local_2b = bVar1 & 4;
        local_2c = bVar1 & 8;
      }
      bVar11 = (local_d4 & 0x18) == 0x18;
    }
  }
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
	double gap = DEFAULT_GAP;
	unsigned long burst_count = DEFAULT_BURST_COUNT;
	unsigned long polltimeout = 0;
	unsigned char extended = 0;
	unsigned char canfd = 0;
	unsigned char brs = 0;
	unsigned char esi = 0;
	unsigned char mix = 0;
	unsigned char id_mode = MODE_RANDOM;
	unsigned char data_mode = MODE_RANDOM;
	unsigned char dlc_mode = MODE_RANDOM;
	unsigned char loopback_disable = 0;
	unsigned char verbose = 0;
	unsigned char rtr_frame = 0;
	unsigned char len8_dlc = 0;
	int count = 0;
	unsigned long burst_sent_count = 0;
	int mtu, maxdlen;
	uint64_t incdata = 0;
	int incdlc = 0;
	unsigned long rnd;
	unsigned char fixdata[CANFD_MAX_DLEN];

	int opt;
	int s; /* socket */

	struct sockaddr_can addr = { 0 };
	static struct canfd_frame frame;
	struct can_frame *ccf = (struct can_frame *)&frame;
	int i;
	struct ifreq ifr;

	struct timeval now;
	int ret;

	/* set seed value for pseudo random numbers */
	gettimeofday(&now, NULL);
	srandom(now.tv_usec);

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	const struct option long_options[] = {
		{ "mark",	required_argument,	0, OPT_MARK, },
		{ "start",	required_argument,	0, OPT_START, },
		{ 0,		0,			0, 0 },
	};

	while ((opt = getopt_long(argc, argv, "g:atefbER8mI:L:D:p:n:ixc:vh?", long_options, NULL)) != -1) {
		switch (opt) {

		case 'g':
			gap = strtod(optarg, NULL);
			break;

		case 'a':
			clock_nanosleep_flags = TIMER_ABSTIME;
			break;

		case 't':
			clock_nanosleep_flags = TIMER_ABSTIME;
			use_so_txtime = true;
			break;

		case OPT_START: {
			int64_t start_time_ns;

			start_time_ns = strtoll(optarg, NULL, 0);
			ts = ns_to_timespec(start_time_ns);

			break;
		}
		case OPT_MARK:
			so_mark_val = strtoul(optarg, NULL, 0);
			break;
		case 'e':
			extended = 1;
			break;

		case 'f':
			canfd = 1;
			break;

		case 'b':
			brs = 1; /* bitrate switch implies CAN FD */
			canfd = 1;
			break;

		case 'E':
			esi = 1; /* error state indicator implies CAN FD */
			canfd = 1;
			break;

		case 'R':
			rtr_frame = 1;
			break;

		case '8':
			len8_dlc = 1;
			break;

		case 'm':
			mix = 1;
			canfd = 1; /* to switch the socket into CAN FD mode */
			break;

		case 'I':
			if (optarg[0] == 'r') {
				id_mode = MODE_RANDOM;
			} else if (optarg[0] == 'i') {
				id_mode = MODE_INCREMENT;
			} else if (optarg[0] == 'e') {
				id_mode = MODE_RANDOM_EVEN;
			} else if (optarg[0] == 'o') {
				id_mode = MODE_RANDOM_ODD;
			} else {
				id_mode = MODE_FIX;
				frame.can_id = strtoul(optarg, NULL, 16);
			}
			break;

		case 'L':
			if (optarg[0] == 'r') {
				dlc_mode = MODE_RANDOM;
			} else if (optarg[0] == 'i') {
				dlc_mode = MODE_INCREMENT;
			} else {
				dlc_mode = MODE_FIX;
				frame.len = atoi(optarg) & 0xFF; /* is cut to 8 / 64 later */
			}
			break;

		case 'D':
			if (optarg[0] == 'r') {
				data_mode = MODE_RANDOM;
			} else if (optarg[0] == 'i') {
				data_mode = MODE_INCREMENT;
			} else {
				data_mode = MODE_FIX;
				if (hexstring2data(optarg, fixdata, CANFD_MAX_DLEN)) {
					printf("wrong fix data definition\n");
					return 1;
				}
			}
			break;

		case 'p':
			polltimeout = strtoul(optarg, NULL, 10);
			break;

		case 'n':
			count = atoi(optarg);
			if (count < 1) {
				print_usage(basename(argv[0]));
				return 1;
			}
			break;

		case 'i':
			ignore_enobufs = true;
			break;

		case 'x':
			loopback_disable = 1;
			break;

		case 'c':
			burst_count = strtoul(optarg, NULL, 10);
			break;

		case 'v':
			verbose++;
			break;

		case '?':
		case 'h':
		default:
			print_usage(basename(argv[0]));
			return 1;
		}
	}

	if (optind == argc) {
		print_usage(basename(argv[0]));
		return 1;
	}

	ts_gap = double_to_timespec(gap / 1000);

	/* recognize obviously missing commandline option */
	if (id_mode == MODE_FIX && frame.can_id > 0x7FF && !extended) {
		printf("The given CAN-ID is greater than 0x7FF and the '-e' option is not set.\n");
		return 1;
	}

	if (strlen(argv[optind]) >= IFNAMSIZ) {
		printf("Name of CAN device '%s' is too long!\n\n", argv[optind]);
		return 1;
	}

	s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket");
		return 1;
	}

	addr.can_family = AF_CAN;
	addr.can_ifindex = if_nametoindex(argv[optind]);
	if (!addr.can_ifindex) {
		perror("if_nametoindex");
		return 1;
	}

	/*
	 * disable default receive filter on this RAW socket
	 * This is obsolete as we do not read from the socket at all, but for
	 * this reason we can remove the receive list in the Kernel to save a
	 * little (really a very little!) CPU usage.
	 */
	setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0);

	if (loopback_disable) {
		const int loopback = 0;

		setsockopt(s, SOL_CAN_RAW, CAN_RAW_LOOPBACK,
			   &loopback, sizeof(loopback));
	}

	if (canfd) {
		const int enable_canfd = 1;

		/* check if the frame fits into the CAN netdevice */
		if (ioctl(s, SIOCGIFMTU, &ifr) < 0) {
			perror("SIOCGIFMTU");
			return 1;
		}

		if (ifr.ifr_mtu != CANFD_MTU) {
			printf("CAN interface is not CAN FD capable - sorry.\n");
			return 1;
		}

		/* interface is ok - try to switch the socket into CAN FD mode */
		if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &enable_canfd, sizeof(enable_canfd))) {
			printf("error when enabling CAN FD support\n");
			return 1;
		}

		/* ensure discrete CAN FD length values 0..8, 12, 16, 20, 24, 32, 64 */
		frame.len = can_fd_dlc2len(can_fd_len2dlc(frame.len));
	} else {
		/* sanitize Classical CAN 2.0 frame length */
		if (len8_dlc) {
			if (frame.len > CAN_MAX_RAW_DLC)
				frame.len = CAN_MAX_RAW_DLC;

			if (frame.len > CAN_MAX_DLEN)
				ccf->len8_dlc = frame.len;
		}

		if (frame.len > CAN_MAX_DLEN)
			frame.len = CAN_MAX_DLEN;
	}

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind");
		return 1;
	}

	if (use_so_txtime) {
		ret = setsockopt_txtime(s);
		if (ret)
			return 1;
	}

	ret = setup_time();
	if (ret)
		return 1;

	while (running) {
		frame.flags = 0;

		if (count && (--count == 0))
			running = 0;

		if (canfd) {
			mtu = CANFD_MTU;
			maxdlen = CANFD_MAX_DLEN;
			if (brs)
				frame.flags |= CANFD_BRS;
			if (esi)
				frame.flags |= CANFD_ESI;
		} else {
			mtu = CAN_MTU;
			maxdlen = CAN_MAX_DLEN;
		}

		if (id_mode == MODE_RANDOM)
			frame.can_id = random();
		else if (id_mode == MODE_RANDOM_EVEN)
			frame.can_id = random() & ~0x1;
		else if (id_mode == MODE_RANDOM_ODD)
			frame.can_id = random() | 0x1;

		if (extended) {
			frame.can_id &= CAN_EFF_MASK;
			frame.can_id |= CAN_EFF_FLAG;
		} else
			frame.can_id &= CAN_SFF_MASK;

		if (rtr_frame && !canfd)
			frame.can_id |= CAN_RTR_FLAG;

		if (dlc_mode == MODE_RANDOM) {
			if (canfd)
				frame.len = can_fd_dlc2len(random() & 0xF);
			else {
				frame.len = random() & 0xF;

				if (frame.len > CAN_MAX_DLEN) {
					/* generate Classic CAN len8 DLCs? */
					if (len8_dlc)
						ccf->len8_dlc = frame.len;

					frame.len = 8; /* for about 50% of the frames */
				} else {
					ccf->len8_dlc = 0;
				}
			}
		}

		if (data_mode == MODE_INCREMENT && !frame.len)
			frame.len = 1; /* min dlc value for incr. data */

		if (data_mode == MODE_RANDOM) {
			rnd = random();
			memcpy(&frame.data[0], &rnd, 4);
			rnd = random();
			memcpy(&frame.data[4], &rnd, 4);

			/* omit extra random number generation for CAN FD */
			if (canfd && frame.len > 8) {
				memcpy(&frame.data[8], &frame.data[0], 8);
				memcpy(&frame.data[16], &frame.data[0], 16);
				memcpy(&frame.data[32], &frame.data[0], 32);
			}
		}

		if (data_mode == MODE_FIX)
			memcpy(frame.data, fixdata, CANFD_MAX_DLEN);

		/* set unused payload data to zero like the CAN driver does it on rx */
		if (frame.len < maxdlen)
			memset(&frame.data[frame.len], 0, maxdlen - frame.len);

		if (!use_so_txtime &&
		    (ts.tv_sec || ts.tv_nsec) &&
		    burst_sent_count >= burst_count) {
			if (clock_nanosleep_flags == TIMER_ABSTIME)
				ts = timespec_add(ts, ts_gap);

			ret = clock_nanosleep(clockid, clock_nanosleep_flags, &ts, NULL);
			if (ret != 0 && ret != EINTR) {
				perror("clock_nanosleep");
				return 1;
			}
		}

		if (verbose) {
			printf("  %s  ", argv[optind]);

			if (verbose > 1)
				fprint_long_canframe(stdout, &frame, "\n", (verbose > 2) ? 1 : 0, maxdlen);
			else
				fprint_canframe(stdout, &frame, "\n", 1, maxdlen);
		}

		ret = do_send_one(s, &frame, mtu, polltimeout);
		if (ret)
			return 1;

		if (burst_sent_count >= burst_count)
			burst_sent_count = 0;
		burst_sent_count++;

		if (id_mode == MODE_INCREMENT)
			frame.can_id++;

		if (dlc_mode == MODE_INCREMENT) {
			incdlc++;
			incdlc %= CAN_MAX_RAW_DLC + 1;

			if (canfd && !mix)
				frame.len = can_fd_dlc2len(incdlc);
			else if (len8_dlc) {
				if (incdlc > CAN_MAX_DLEN) {
					frame.len = CAN_MAX_DLEN;
					ccf->len8_dlc = incdlc;
				} else {
					frame.len = incdlc;
					ccf->len8_dlc = 0;
				}
			} else {
				incdlc %= CAN_MAX_DLEN + 1;
				frame.len = incdlc;
			}
		}

		if (data_mode == MODE_INCREMENT) {
			incdata++;

			for (i = 0; i < 8; i++)
				frame.data[i] = incdata >> i * 8;
		}

		if (mix) {
			i = random();
			extended = i & 1;
			canfd = i & 2;
			if (canfd) {
				brs = i & 4;
				esi = i & 8;
			}
			rtr_frame = ((i & 24) == 24); /* reduce RTR frames to 1/4 */
		}
	}

	if (enobufs_count)
		printf("\nCounted %llu ENOBUFS return values on write().\n\n",
		       enobufs_count);

	close(s);

	return 0;
}